

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O2

int on_ack_stream_ack_cached(quicly_conn_t *conn)

{
  int iVar1;
  
  iVar1 = on_ack_stream_ack_one
                    (conn,(conn->stash).on_ack_stream.active_acked_cache.stream_id,
                     &(conn->stash).on_ack_stream.active_acked_cache.args);
  (conn->stash).on_ack_stream.active_acked_cache.stream_id = -0x8000000000000000;
  return iVar1;
}

Assistant:

static int on_ack_stream_ack_cached(quicly_conn_t *conn)
{
    int ret;

    if (conn->stash.on_ack_stream.active_acked_cache.stream_id == INT64_MIN)
        return 0;
    ret = on_ack_stream_ack_one(conn, conn->stash.on_ack_stream.active_acked_cache.stream_id,
                                &conn->stash.on_ack_stream.active_acked_cache.args);
    conn->stash.on_ack_stream.active_acked_cache.stream_id = INT64_MIN;
    return ret;
}